

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O3

void snowhouse::ConfigurableAssert<snowhouse::DefaultFailureHandler>::
     That<int,snowhouse::ConstraintList<snowhouse::NotOperator,snowhouse::ConstraintList<snowhouse::ConstraintAdapter<snowhouse::EqualsConstraint<int>>,snowhouse::Nil>>>
               (int *actual,
               ExpressionBuilder<snowhouse::ConstraintList<snowhouse::NotOperator,_snowhouse::ConstraintList<snowhouse::ConstraintAdapter<snowhouse::EqualsConstraint<int>_>,_snowhouse::Nil>_>_>
               *expression,char *file_name,int line_number)

{
  _Elt_pointer ppCVar1;
  _Elt_pointer pbVar2;
  string *psVar3;
  OperatorStack operators;
  ResultStack result;
  undefined1 *local_118;
  long local_110;
  undefined1 local_108 [16];
  _Deque_base<snowhouse::ConstraintOperator_*,_std::allocator<snowhouse::ConstraintOperator_*>_>
  local_f8;
  _Deque_base<bool,_std::allocator<bool>_> local_a8;
  
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<bool,_std::allocator<bool>_>::_M_initialize_map(&local_a8,0);
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<snowhouse::ConstraintOperator_*,_std::allocator<snowhouse::ConstraintOperator_*>_>::
  _M_initialize_map(&local_f8,0);
  NotOperator::
  Evaluate<snowhouse::ConstraintList<snowhouse::NotOperator,snowhouse::ConstraintList<snowhouse::ConstraintAdapter<snowhouse::EqualsConstraint<int>>,snowhouse::Nil>>,int>
            ((NotOperator *)expression,&expression->m_constraint_list,(ResultStack *)&local_a8,
             (OperatorStack *)&local_f8,actual);
  if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_f8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      ppCVar1 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_f8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppCVar1 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      (**ppCVar1[-1]->_vptr_ConstraintOperator)(ppCVar1[-1],&local_a8);
      if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_f8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        operator_delete(local_f8._M_impl.super__Deque_impl_data._M_finish._M_first);
        local_f8._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_f8._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_f8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
        local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_f8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
        local_f8._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_f8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
    } while (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_f8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_a8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    pbVar2 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pbVar2 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x200;
    }
    if (pbVar2[-1] == false) {
      DefaultFailureHandler::
      Handle<snowhouse::ExpressionBuilder<snowhouse::ConstraintList<snowhouse::NotOperator,snowhouse::ConstraintList<snowhouse::ConstraintAdapter<snowhouse::EqualsConstraint<int>>,snowhouse::Nil>>>,int>
                (expression,actual,file_name,line_number);
    }
    std::
    _Deque_base<snowhouse::ConstraintOperator_*,_std::allocator<snowhouse::ConstraintOperator_*>_>::
    ~_Deque_base(&local_f8);
    std::_Deque_base<bool,_std::allocator<bool>_>::~_Deque_base(&local_a8);
    return;
  }
  psVar3 = (string *)__cxa_allocate_exception(0x20);
  local_118 = local_108;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,"The expression did not yield any result","");
  *(string **)psVar3 = psVar3 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar3,local_118,local_118 + local_110);
  __cxa_throw(psVar3,&InvalidExpressionException::typeinfo,
              InvalidExpressionException::~InvalidExpressionException);
}

Assistant:

static void That(const ActualType& actual, ExpressionBuilder<ConstraintListType> expression, const char* file_name, int line_number)
      {
         try 
         {
            ResultStack result;
            OperatorStack operators;
            expression.Evaluate(result, operators, actual);

            while (!operators.empty())
            {
               ConstraintOperator* op = operators.top();
               op->PerformOperation(result);
               operators.pop();
            }

            if (result.empty())
            {
               throw InvalidExpressionException("The expression did not yield any result");
            }

            if (!result.top())
            {
               FailureHandler::Handle(expression, actual, file_name, line_number);
            }      
         }
         catch (const InvalidExpressionException& e) 
         {
            FailureHandler::Handle("Malformed expression: \"" + snowhouse::Stringize(expression) + "\"\n" + e.Message());
         }
      }